

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Card.cpp
# Opt level: O2

void __thiscall Card::PrintCardStats(Card *this)

{
  switch(this->type) {
  case PERSONALITY:
    Personality::PrintPersonality((Personality *)this);
    return;
  case HOLDING:
    Holding::PrintHolding((Holding *)this);
    return;
  case FOLLOWER:
    Follower::PrintFollower((Follower *)this);
    return;
  case ITEM:
    Item::PrintItem((Item *)this);
    return;
  default:
    exit(-1);
  }
}

Assistant:

void Card::PrintCardStats()                                 //defines type of card and calls proper print function for that type
{
    if (type == FOLLOWER)
    {
        Follower * fol = reinterpret_cast<Follower *> (this);
        fol->PrintFollower();

        fol = nullptr;
        delete fol;
    }
    else if (type == ITEM)
    {
        Item * item = reinterpret_cast<Item *> (this);
        item->PrintItem();

        item = nullptr;
        delete item;
    }
    else if (type == PERSONALITY)
    {
        Personality* pers = reinterpret_cast<Personality*> (this);
        pers->PrintPersonality();

        pers = nullptr;
        delete pers;
    }
    else if (type == HOLDING)
    {
        Holding * hold = reinterpret_cast<Holding*>(this);
        hold->PrintHolding();

        hold = nullptr;
        delete hold;
    }
    else
        exit(-1);
}